

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O0

bool Imath_3_2::(anonymous_namespace)::jacobiRotation<0,1,2,double>
               (Matrix33<double> *A,Matrix33<double> *V,Vec3<double> *Z,double tol)

{
  double dVar1;
  bool bVar2;
  double *pdVar3;
  double *pdVar4;
  Vec3<double> *in_RDX;
  int __x;
  Matrix33<double> *in_RDI;
  Matrix33<double> *pMVar5;
  double in_XMM0_Qa;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar6;
  double extraout_XMM0_Qa_01;
  double dVar7;
  double dVar8;
  double dVar9;
  double nu2;
  double nu1;
  double *offd2;
  double *offd1;
  double h;
  double tau;
  double s;
  double c;
  double t;
  double rho;
  double mu2;
  double mu1;
  double z;
  double y;
  double x;
  double tau_00;
  
  pdVar3 = Matrix33<double>::operator[](in_RDI,0);
  dVar6 = *pdVar3;
  pdVar3 = Matrix33<double>::operator[](in_RDI,0);
  dVar1 = pdVar3[1];
  pMVar5 = in_RDI;
  pdVar3 = Matrix33<double>::operator[](in_RDI,1);
  dVar7 = pdVar3[1];
  __x = (int)pMVar5;
  std::abs(__x);
  tau_00 = extraout_XMM0_Qa;
  std::abs(__x);
  bVar2 = in_XMM0_Qa * extraout_XMM0_Qa_00 < tau_00;
  if (bVar2) {
    dVar6 = (dVar7 - dVar6) / (dVar1 * 2.0);
    std::abs(__x);
    dVar7 = sqrt(dVar6 * dVar6 + 1.0);
    dVar8 = (double)(~-(ulong)(dVar6 < 0.0) & 0x3ff0000000000000 |
                    (ulong)((uint)(-(ulong)(dVar6 < 0.0) >> 0x20) & 0xbff00000) << 0x20) /
            (extraout_XMM0_Qa_01 + dVar7);
    dVar6 = sqrt(dVar8 * dVar8 + 1.0);
    dVar7 = dVar8 * (1.0 / dVar6);
    dVar9 = dVar7 / (1.0 / dVar6 + 1.0);
    dVar8 = dVar8 * dVar1;
    pdVar3 = Vec3<double>::operator[](in_RDX,0);
    *pdVar3 = *pdVar3 - dVar8;
    pdVar3 = Vec3<double>::operator[](in_RDX,1);
    *pdVar3 = dVar8 + *pdVar3;
    pdVar3 = Matrix33<double>::operator[](in_RDI,0);
    *pdVar3 = *pdVar3 - dVar8;
    pdVar3 = Matrix33<double>::operator[](in_RDI,1);
    pdVar3[1] = dVar8 + pdVar3[1];
    pdVar3 = Matrix33<double>::operator[](in_RDI,0);
    pdVar3[1] = 0.0;
    pdVar3 = Matrix33<double>::operator[](in_RDI,0);
    pdVar4 = Matrix33<double>::operator[](in_RDI,1);
    dVar6 = pdVar3[2];
    pMVar5 = (Matrix33<double> *)pdVar4[2];
    pdVar3[2] = -dVar7 * (dVar9 * dVar6 + (double)pMVar5) + dVar6;
    pdVar4[2] = dVar7 * (-dVar9 * (double)pMVar5 + dVar6) + (double)pMVar5;
    jacobiRotateRight<0,1,Imath_3_2::Matrix33<double>>(pMVar5,in_XMM0_Qa,tau_00);
  }
  else {
    pdVar3 = Matrix33<double>::operator[](in_RDI,0);
    pdVar3[1] = 0.0;
  }
  return bVar2;
}

Assistant:

bool
jacobiRotation (Matrix33<T>& A, Matrix33<T>& V, Vec3<T>& Z, const T tol)
{
    // Load everything into local variables to make things easier on the
    // optimizer:
    const T x = A[j][j];
    const T y = A[j][k];
    const T z = A[k][k];

    // The first stage diagonalizes,
    //   [ c  s ]^T [ x y ] [ c -s ]  = [ d1   0 ]
    //   [ -s c ]   [ y z ] [ s  c ]    [  0  d2 ]
    const T mu1 = z - x;
    const T mu2 = 2 * y;

    if (std::abs (mu2) <= tol * std::abs (mu1))
    {
        // We've decided that the off-diagonal entries are already small
        // enough, so we'll set them to zero.  This actually appears to result
        // in smaller errors than leaving them be, possibly because it prevents
        // us from trying to do extra rotations later that we don't need.
        A[j][k] = 0;
        return false;
    }
    const T rho = mu1 / mu2;
    const T t   = (rho < 0 ? T (-1) : T (1)) /
                (std::abs (rho) + std::sqrt (1 + rho * rho));
    const T c   = T (1) / std::sqrt (T (1) + t * t);
    const T s   = t * c;
    const T tau = s / (T (1) + c);
    const T h   = t * y;

    // Update diagonal elements.
    Z[j] -= h;
    Z[k] += h;
    A[j][j] -= h;
    A[k][k] += h;

    // For the entries we just zeroed out, we'll just set them to 0, since
    // they should be 0 up to machine precision.
    A[j][k] = 0;

    // We only update upper triagnular elements of A, since
    // A is supposed to be symmetric.
    T&      offd1 = l < j ? A[l][j] : A[j][l];
    T&      offd2 = l < k ? A[l][k] : A[k][l];
    const T nu1   = offd1;
    const T nu2   = offd2;
    offd1         = nu1 - s * (nu2 + tau * nu1);
    offd2         = nu2 + s * (nu1 - tau * nu2);

    // Apply rotation to V
    jacobiRotateRight<j, k> (V, s, tau);

    return true;
}